

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall
HighsCutGeneration::tryGenerateCut
          (HighsCutGeneration *this,vector<int,_std::allocator<int>_> *inds_,
          vector<double,_std::allocator<double>_> *vals_,bool hasUnboundedInts,bool hasGeneralInts,
          bool hasContinuous,double minEfficacy,bool onlyInitialCMIRScale,bool allowRejectCut,
          bool lpSol)

{
  HighsCDouble *pHVar1;
  double *pdVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer puVar5;
  double dVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer puVar11;
  pointer puVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined7 in_register_00000009;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  double dVar23;
  HighsCDouble tmpRhs;
  double sqrnorm;
  double violation;
  HighsCDouble __tmp;
  double local_100;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  _Vector_base<double,_std::allocator<double>_> local_78;
  double local_60;
  double local_58;
  double local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if ((int)CONCAT71(in_register_00000009,hasUnboundedInts) != 0) {
    bVar17 = cmirCutGenerationHeuristic(this,minEfficacy,onlyInitialCMIRScale);
    return bVar17;
  }
  std::vector<double,std::allocator<double>>::vector<double*,void>
            ((vector<double,std::allocator<double>> *)&local_a8,this->vals,this->vals + this->rowlen
             ,(allocator_type *)&local_f8);
  std::vector<int,std::allocator<int>>::vector<int*,void>
            ((vector<int,std::allocator<int>> *)&local_f8,this->inds,this->inds + this->rowlen,
             (allocator_type *)&local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
             &this->complementation);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_78,&this->solval);
  local_88 = (this->rhs).hi;
  uStack_80 = (this->rhs).lo;
  bVar17 = determineCover(this,lpSol);
  pHVar1 = &this->rhs;
  local_100 = minEfficacy;
  if (bVar17) {
    if (hasContinuous || hasGeneralInts) {
      if (hasGeneralInts) {
        bVar17 = separateLiftedMixedIntegerCover(this);
      }
      else {
        bVar17 = separateLiftedMixedBinaryCover(this);
      }
      if (bVar17 == false) goto LAB_00293a97;
    }
    else {
      separateLiftedKnapsackCover(this);
    }
    bVar17 = this->integralSupport;
    bVar21 = this->integralCoefficients;
    local_50 = -((this->rhs).hi + (this->rhs).lo);
    local_58 = 0.0;
    pdVar2 = this->vals;
    uVar20 = 0;
    uVar22 = (ulong)(uint)this->rowlen;
    local_d8 = inds_;
    local_d0 = vals_;
    if (this->rowlen < 1) {
      uVar22 = 0;
    }
    for (; uVar22 != uVar20; uVar20 = uVar20 + 1) {
      updateViolationAndNorm(this,(HighsInt)uVar20,pdVar2[uVar20],&local_50,&local_58);
    }
    if (local_58 < 0.0) {
      local_60 = local_50;
      dVar6 = sqrt(local_58);
      dVar23 = local_60;
    }
    else {
      dVar6 = SQRT(local_58);
      dVar23 = local_50;
    }
    dVar23 = dVar23 / dVar6;
    uVar13 = (undefined4)local_88;
    uVar14 = local_88._4_4_;
    uVar15 = (undefined4)uStack_80;
    uVar16 = uStack_80._4_4_;
    if (!allowRejectCut || minEfficacy < dVar23) {
      local_100 = minEfficacy + dVar23;
      local_48 = (undefined4)local_88;
      uStack_44 = local_88._4_4_;
      uStack_40 = (undefined4)uStack_80;
      uStack_3c = uStack_80._4_4_;
      local_88 = pHVar1->hi;
      uStack_80 = (this->rhs).lo;
    }
    *(undefined4 *)&pHVar1->hi = uVar13;
    *(undefined4 *)((long)&(this->rhs).hi + 4) = uVar14;
    *(undefined4 *)&(this->rhs).lo = uVar15;
    *(undefined4 *)((long)&(this->rhs).lo + 4) = uVar16;
    bVar18 = !allowRejectCut || minEfficacy < dVar23;
    vals_ = local_d0;
    inds_ = local_d8;
  }
  else {
LAB_00293a97:
    bVar18 = false;
    bVar17 = false;
    bVar21 = false;
  }
  this->inds = local_f8._M_impl.super__Vector_impl_data._M_start;
  this->vals = local_a8._M_impl.super__Vector_impl_data._M_start;
  bVar19 = cmirCutGenerationHeuristic(this,local_100,onlyInitialCMIRScale);
  if (bVar19) {
    piVar3 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar7 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar8 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = local_f8._M_impl.super__Vector_impl_data._M_start;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = local_f8._M_impl.super__Vector_impl_data._M_finish;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_f8._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar4 = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar9 = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_a8._M_impl.super__Vector_impl_data._M_start;
    (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_a8._M_impl.super__Vector_impl_data._M_finish;
    (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
    this->inds = local_f8._M_impl.super__Vector_impl_data._M_start;
    this->vals = local_a8._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_impl.super__Vector_impl_data._M_start = piVar7;
    local_f8._M_impl.super__Vector_impl_data._M_finish = piVar8;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = piVar3;
    local_a8._M_impl.super__Vector_impl_data._M_start = pdVar9;
    local_a8._M_impl.super__Vector_impl_data._M_finish = pdVar10;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar4;
  }
  else {
    if (!bVar18) {
      bVar17 = false;
      goto LAB_00293c7d;
    }
    pHVar1->hi = local_88;
    (this->rhs).lo = uStack_80;
    puVar5 = (this->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_c8._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar11 = (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_c8._M_impl.super__Vector_impl_data._M_start;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_c8._M_impl.super__Vector_impl_data._M_finish;
    pdVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar9 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = local_78._M_impl.super__Vector_impl_data._M_start;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = local_78._M_impl.super__Vector_impl_data._M_finish;
    this->inds = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    this->vals = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    this->integralSupport = bVar17;
    this->integralCoefficients = bVar21;
    local_c8._M_impl.super__Vector_impl_data._M_start = puVar11;
    local_c8._M_impl.super__Vector_impl_data._M_finish = puVar12;
    local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = puVar5;
    local_78._M_impl.super__Vector_impl_data._M_start = pdVar9;
    local_78._M_impl.super__Vector_impl_data._M_finish = pdVar10;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar4;
  }
  bVar17 = true;
LAB_00293c7d:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
  return bVar17;
}

Assistant:

bool HighsCutGeneration::tryGenerateCut(std::vector<HighsInt>& inds_,
                                        std::vector<double>& vals_,
                                        bool hasUnboundedInts,
                                        bool hasGeneralInts, bool hasContinuous,
                                        double minEfficacy,
                                        bool onlyInitialCMIRScale,
                                        bool allowRejectCut, bool lpSol) {
  // use cmir if there are unbounded integer variables
  if (hasUnboundedInts)
    return cmirCutGenerationHeuristic(minEfficacy, onlyInitialCMIRScale);

  // 0. Save data before determining cover and applying lifting functions
  std::vector<double> tmpVals(vals, vals + rowlen);
  std::vector<HighsInt> tmpInds(inds, inds + rowlen);
  std::vector<uint8_t> tmpComplementation(complementation);
  std::vector<double> tmpSolval(solval);
  HighsCDouble tmpRhs = rhs;

  // 1. Determine a cover, cover does not need to be minimal as neither of
  //    the lifting functions have minimality of the cover as necessary facet
  //    condition
  bool success = false;
  bool saveIntegalSupport = false;
  bool saveIntegralCoefficients = false;
  do {
    if (!determineCover(lpSol)) break;

    // 2. use superadditive lifting function depending on structure of base
    //    inequality:
    //    We have 3 lifting functions available for pure binary knapsack sets,
    //    for mixed-binary knapsack sets and for mixed integer knapsack sets.
    if (!hasContinuous && !hasGeneralInts) {
      separateLiftedKnapsackCover();
      success = true;
    } else if (hasGeneralInts) {
      success = separateLiftedMixedIntegerCover();
    } else {
      assert(hasContinuous);
      assert(!hasGeneralInts);
      success = separateLiftedMixedBinaryCover();
    }
  } while (false);

  double minMirEfficacy = minEfficacy;
  if (success) {
    // save data that might otherwise be overwritten when calling the cmir
    // separator
    saveIntegalSupport = integralSupport;
    saveIntegralCoefficients = integralCoefficients;

    // compute violation and squared norm
    double violation = -double(rhs);
    double sqrnorm = 0.0;
    for (HighsInt i = 0; i < rowlen; ++i) {
      updateViolationAndNorm(i, vals[i], violation, sqrnorm);
    }

    // compute efficacy (distance cut off)
    double efficacy = violation / std::sqrt(sqrnorm);
    if (allowRejectCut && efficacy <= minEfficacy) {
      // reject cut
      success = false;
      rhs = tmpRhs;
    } else {
      // accept cut and increase minimum efficiency requirement for cmir cut
      minMirEfficacy += efficacy;
      std::swap(tmpRhs, rhs);
    }
  }

  // restore indices and values; lifting methods do not modify complementation
  // and, thus, complementation-related data does not have to be restored here.
  inds = tmpInds.data();
  vals = tmpVals.data();

  if (cmirCutGenerationHeuristic(minMirEfficacy, onlyInitialCMIRScale)) {
    // take the cmir cut as it is better
    inds_.swap(tmpInds);
    vals_.swap(tmpVals);
    inds = inds_.data();
    vals = vals_.data();
    return true;
  } else if (success) {
    // take the previous lifted cut as cmir could not improve
    // we restore the old complementation vector, right hand side, and values
    rhs = tmpRhs;
    // note that the solution vector solval also needs to be restored because it
    // depends on the complementation. it would be OK not to restore solval, if
    // there would be a guarantee that it is not used from here on.
    complementation.swap(tmpComplementation);
    solval.swap(tmpSolval);
    inds = inds_.data();
    vals = vals_.data();
    // restore indicators
    integralSupport = saveIntegalSupport;
    integralCoefficients = saveIntegralCoefficients;
    return true;
  } else
    // neither cmir nor lifted cut successful
    return false;
}